

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testExistingStreams.cpp
# Opt level: O3

void anon_unknown.dwarf_152ab5::fillPixels1(Array2D<Imf_2_5::Rgba> *pixels,int w,int h)

{
  Rgba *pRVar1;
  ushort uVar2;
  unsigned_short uVar3;
  ushort uVar4;
  uint uVar5;
  long lVar6;
  int x;
  ulong uVar7;
  int y;
  ulong uVar8;
  float i;
  float fVar9;
  uif x_1;
  long local_40;
  
  local_40 = 0;
  uVar8 = 0;
  do {
    i = (float)((uint)uVar8 & 1);
    uVar7 = 0;
    do {
      fVar9 = (float)((uint)uVar7 & 1);
      lVar6 = pixels->_sizeY;
      pRVar1 = pixels->_data;
      if ((uVar7 & 1) == 0) {
        uVar3 = (unsigned_short)((uint)fVar9 >> 0x10);
      }
      else if (half::_eLut[(uint)fVar9 >> 0x17] == 0) {
        uVar3 = half::convert((int)fVar9);
      }
      else {
        uVar3 = half::_eLut[(uint)fVar9 >> 0x17] +
                (short)(((uint)fVar9 & 0x7fffff) + 0xfff + (uint)(((uint)fVar9 >> 0xd & 1) != 0) >>
                       0xd);
      }
      uVar5 = (uint)uVar7 + (uint)uVar8;
      fVar9 = (float)(uVar5 & 1);
      lVar6 = lVar6 * local_40;
      *(unsigned_short *)((long)&pRVar1[uVar7].r._h + lVar6) = uVar3;
      if ((uVar5 & 1) == 0) {
        uVar4 = (ushort)((uint)fVar9 >> 0x10);
      }
      else if (half::_eLut[(uint)fVar9 >> 0x17] == 0) {
        uVar4 = half::convert((int)fVar9);
      }
      else {
        uVar4 = half::_eLut[(uint)fVar9 >> 0x17] +
                (short)(((uint)fVar9 & 0x7fffff) + 0xfff + (uint)(((uint)fVar9 >> 0xd & 1) != 0) >>
                       0xd);
      }
      *(ushort *)((long)&pRVar1[uVar7].g._h + lVar6) = uVar4;
      uVar5 = (uint)i >> 0x10;
      if ((uVar8 & 1) != 0) {
        if (half::_eLut[(uint)i >> 0x17] == 0) {
          uVar2 = half::convert((int)i);
          uVar4 = *(unsigned_short *)((long)&pRVar1[uVar7].g._h + lVar6);
          uVar5 = (uint)uVar2;
        }
        else {
          uVar5 = (uint)half::_eLut[(uint)i >> 0x17] +
                  (((uint)i & 0x7fffff) + 0xfff + (uint)(((uint)i >> 0xd & 1) != 0) >> 0xd);
        }
      }
      *(unsigned_short *)((long)&pRVar1[uVar7].b._h + lVar6) = (unsigned_short)uVar5;
      fVar9 = (half::_toFloat[*(unsigned_short *)((long)&pRVar1[uVar7].r._h + lVar6)].f +
               half::_toFloat[uVar5 & 0xffff].f + half::_toFloat[uVar4].f) / 3.0;
      if ((fVar9 != 0.0) || (NAN(fVar9))) {
        if (half::_eLut[(uint)fVar9 >> 0x17] == 0) {
          uVar3 = half::convert((int)fVar9);
        }
        else {
          uVar3 = half::_eLut[(uint)fVar9 >> 0x17] +
                  (short)(((uint)fVar9 & 0x7fffff) + 0xfff + (uint)(((uint)fVar9 >> 0xd & 1) != 0)
                         >> 0xd);
        }
      }
      else {
        uVar3 = (unsigned_short)((uint)fVar9 >> 0x10);
      }
      *(unsigned_short *)((long)&pRVar1[uVar7].a._h + lVar6) = uVar3;
      uVar7 = uVar7 + 1;
    } while (uVar7 != 0x77);
    uVar8 = uVar8 + 1;
    local_40 = local_40 + 8;
  } while (uVar8 != 0xed);
  return;
}

Assistant:

void
fillPixels1 (Array2D<Rgba> &pixels, int w, int h)
{
    for (int y = 0; y < h; ++y)
    {
	for (int x = 0; x < w; ++x)
	{
	    Rgba &p = pixels[y][x];

	    p.r = (x & 1);
	    p.g = ((x + y) & 1);
	    p.b = (y & 1);
	    p.a = (p.r + p.b + p.g) / 3.0;
	}
    }
}